

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::Tables::RollbackToLastCheckpoint(Tables *this)

{
  size_t *psVar1;
  SymbolsByNameSet *this_00;
  __node_base *p_Var2;
  size_type *psVar3;
  pointer *ppRVar4;
  pointer *ppCVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  _Hash_node_base *p_Var9;
  _Hash_node_base *p_Var10;
  Block *pBVar11;
  Block *pBVar12;
  char *str;
  LogMessage *pLVar13;
  pointer pCVar14;
  pointer ppcVar15;
  char *pcVar16;
  __node_base_ptr p_Var17;
  __node_base_ptr p_Var18;
  __hash_code __code;
  char *pcVar19;
  ulong __bkt;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  __buckets_ptr pp_Var23;
  pointer ppVar24;
  pointer pRVar25;
  StringPiece SVar26;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  pVar27;
  QueryKey name;
  StringPiece local_88;
  key_type local_78;
  undefined1 local_70 [16];
  undefined8 uStack_60;
  _Alloc_hider _Stack_58;
  Block *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  Block *pBStack_38;
  
  pCVar14 = (this->checkpoints_).
            super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->checkpoints_).
      super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
      ._M_impl.super__Vector_impl_data._M_start == pCVar14) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x577);
    pLVar13 = internal::LogMessage::operator<<
                        ((LogMessage *)local_70,"CHECK failed: !checkpoints_.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar13);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    pCVar14 = (this->checkpoints_).
              super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar21 = (ulong)pCVar14[-1].pending_symbols_before_checkpoint;
  ppcVar15 = (this->symbols_after_checkpoint_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar21 < (ulong)((long)(this->symbols_after_checkpoint_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppcVar15 >> 3)) {
    this_00 = &this->symbols_by_name_;
    p_Var2 = &(this->symbols_by_name_)._M_h._M_before_begin;
    do {
      local_70._8_8_ = (char *)0x0;
      uStack_60._0_4_ = 0;
      uStack_60._4_4_ = 0;
      stringpiece_internal::StringPiece::StringPiece(&local_88,ppcVar15[uVar21]);
      local_70._8_8_ = local_88.ptr_;
      uStack_60 = (Block *)local_88.length_;
      local_70[0] = 10;
      local_88.ptr_ = (char *)local_70;
      local_78.ptr_ = (SymbolBase *)local_70;
      SVar26 = Symbol::full_name((Symbol *)&local_88);
      pcVar16 = SVar26.ptr_;
      if ((long)SVar26.length_ < 1) {
        __code = 0;
      }
      else {
        pcVar19 = pcVar16 + SVar26.length_;
        __code = 0;
        do {
          __code = (long)*pcVar16 + __code * 5;
          pcVar16 = pcVar16 + 1;
        } while (pcVar16 < pcVar19);
      }
      __bkt = __code % (this->symbols_by_name_)._M_h._M_bucket_count;
      p_Var17 = std::
                _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::_M_find_before_node(&this_00->_M_h,__bkt,&local_78,__code);
      if (p_Var17 != (__node_base_ptr)0x0) {
        p_Var9 = p_Var17->_M_nxt;
        pp_Var23 = (this_00->_M_h)._M_buckets;
        p_Var10 = p_Var9->_M_nxt;
        if (pp_Var23[__bkt] == p_Var17) {
          p_Var18 = p_Var17;
          if (p_Var10 != (_Hash_node_base *)0x0) {
            uVar20 = (ulong)p_Var10[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count;
            if (uVar20 == __bkt) goto LAB_00343c62;
            pp_Var23[uVar20] = pp_Var23[__bkt];
            pp_Var23 = (this_00->_M_h)._M_buckets;
            p_Var18 = pp_Var23[__bkt];
          }
          if (p_Var2 == p_Var18) {
            p_Var2->_M_nxt = p_Var10;
          }
          pp_Var23[__bkt] = (__node_base_ptr)0x0;
        }
        else if ((p_Var10 != (_Hash_node_base *)0x0) &&
                (uVar20 = (ulong)p_Var10[2]._M_nxt % (this->symbols_by_name_)._M_h._M_bucket_count,
                uVar20 != __bkt)) {
          pp_Var23[uVar20] = p_Var17;
        }
LAB_00343c62:
        p_Var17->_M_nxt = p_Var9->_M_nxt;
        operator_delete(p_Var9);
        psVar3 = &(this->symbols_by_name_)._M_h._M_element_count;
        *psVar3 = *psVar3 - 1;
      }
      uVar21 = uVar21 + 1;
      ppcVar15 = (this->symbols_after_checkpoint_).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(this->symbols_after_checkpoint_).
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar15 >> 3)
            );
  }
  uVar21 = (ulong)pCVar14[-1].pending_files_before_checkpoint;
  ppcVar15 = (this->files_after_checkpoint_).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar21 < (ulong)((long)(this->files_after_checkpoint_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppcVar15 >> 3)) {
    do {
      stringpiece_internal::StringPiece::StringPiece((StringPiece *)local_70,ppcVar15[uVar21]);
      std::
      _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(this->files_by_name_)._M_h,(StringPiece *)local_70);
      uVar21 = uVar21 + 1;
      ppcVar15 = (this->files_after_checkpoint_).
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(this->files_after_checkpoint_).
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar15 >> 3)
            );
  }
  uVar21 = (ulong)pCVar14[-1].pending_extensions_before_checkpoint;
  ppVar24 = (this->extensions_after_checkpoint_).
            super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (uVar21 < (ulong)((long)(this->extensions_after_checkpoint_).
                             super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar24 >> 4)) {
    lVar22 = uVar21 << 4;
    do {
      pVar27 = std::
               _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::equal_range(&(this->extensions_)._M_t,(key_type *)((long)&ppVar24->first + lVar22))
      ;
      std::
      _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
      ::_M_erase_aux(&(this->extensions_)._M_t,(_Base_ptr)pVar27.first._M_node,
                     (_Base_ptr)pVar27.second._M_node);
      uVar21 = uVar21 + 1;
      ppVar24 = (this->extensions_after_checkpoint_).
                super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x10;
    } while (uVar21 < (ulong)((long)(this->extensions_after_checkpoint_).
                                    super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar24 >> 4)
            );
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->symbols_after_checkpoint_,(long)pCVar14[-1].pending_symbols_before_checkpoint);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            (&this->files_after_checkpoint_,(long)pCVar14[-1].pending_files_before_checkpoint);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::resize(&this->extensions_after_checkpoint_,
           (long)pCVar14[-1].pending_extensions_before_checkpoint);
  iVar8 = pCVar14[-1].arena_before_checkpoint;
  if ((ulong)(long)iVar8 < (this->arena_).num_allocations_) {
    do {
      pRVar25 = (this->arena_).rollback_info_.
                super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->arena_).rollback_info_.
          super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
          ._M_impl.super__Vector_impl_data._M_start == pRVar25) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x303);
        pLVar13 = internal::LogMessage::operator<<
                            ((LogMessage *)local_70,"CHECK failed: !rollback_info_.empty(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar13);
        internal::LogMessage::~LogMessage((LogMessage *)local_70);
        pRVar25 = (this->arena_).rollback_info_.
                  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pBVar11 = pRVar25[-1].block;
      uVar7 = pBVar11->end_offset;
      bVar6 = *(byte *)((long)&pBVar11[1].start_offset + (ulong)uVar7);
      if (bVar6 < 0x11) {
        (**(code **)((anonymous_namespace)::TableArena::
                     VisitAlloc<google::protobuf::(anonymous_namespace)::TableArena::DestroyVisitor,google::protobuf::(anonymous_namespace)::TableArena::OutOfLineAlloc,std::__cxx11::string,std::array<std::__cxx11::string,2ul>,std::array<std::__cxx11::string,3ul>,std::array<std::__cxx11::string,4ul>,std::array<std::__cxx11::string,5ul>,google::protobuf::FileDescriptorTables,google::protobuf::SourceCodeInfo,google::protobuf::FileOptions,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions>(char*,unsigned_short*,unsigned_short*,google::protobuf::(anonymous_namespace)::TableArena::DestroyVisitor,google::protobuf::(anonymous_namespace)::TableArena::TypeList<google::protobuf::(anonymous_namespace)::TableArena::OutOfLineAlloc,std::__cxx11::string,std::array<std::__cxx11::string,2ul>,std::array<std::__cxx11::string,3ul>,std::array<std::__cxx11::string,4ul>,std::array<std::__cxx11::string,5ul>,google::protobuf::FileDescriptorTables,google::protobuf::SourceCodeInfo,google::protobuf::FileOptions,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions>)
                     ::kFuncs + (ulong)(ushort)bVar6 * 8))(pBVar11 + 1,pBVar11);
        uVar7 = pBVar11->end_offset;
      }
      else {
        pBVar11->start_offset = (ushort)bVar6 * -8 + pBVar11->start_offset + 0x80;
      }
      pBVar11->end_offset = uVar7 + 1;
      psVar1 = &pRVar25[-1].count;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) {
        ppRVar4 = &(this->arena_).rollback_info_.
                   super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar4 = *ppRVar4 + -1;
      }
      uVar21 = (this->arena_).num_allocations_ - 1;
      (this->arena_).num_allocations_ = uVar21;
    } while ((ulong)(long)iVar8 < uVar21);
  }
  local_70._0_8_ = (this->arena_).current_;
  local_70._8_8_ = (this->arena_).full_blocks_;
  uStack_60 = (this->arena_).small_size_blocks_._M_elems[0];
  _Stack_58._M_p = (pointer)(this->arena_).small_size_blocks_._M_elems[1];
  local_50 = (this->arena_).small_size_blocks_._M_elems[2];
  aStack_48._M_allocated_capacity = (size_type)(this->arena_).small_size_blocks_._M_elems[3];
  aStack_48._8_8_ = (this->arena_).small_size_blocks_._M_elems[4];
  pBStack_38 = (this->arena_).small_size_blocks_._M_elems[5];
  (this->arena_).small_size_blocks_._M_elems[5] = (Block *)0x0;
  (this->arena_).full_blocks_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[3] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[4] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[1] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[2] = (Block *)0x0;
  (this->arena_).current_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[0] = (Block *)0x0;
  lVar22 = 0;
  do {
    pBVar11 = *(Block **)(local_70 + lVar22);
    while (pBVar11 != (Block *)0x0) {
      pBVar12 = pBVar11->next;
      if (pBVar11->start_offset == 0) {
        operator_delete(pBVar11);
        pBVar11 = pBVar12;
      }
      else {
        anon_unknown_1::TableArena::RelocateToUsedList(&this->arena_,pBVar11);
        pBVar11 = pBVar12;
      }
    }
    lVar22 = lVar22 + 8;
  } while (lVar22 != 0x40);
  ppCVar5 = &(this->checkpoints_).
             super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppCVar5 = *ppCVar5 + -1;
  return;
}

Assistant:

void DescriptorPool::Tables::RollbackToLastCheckpoint() {
  GOOGLE_DCHECK(!checkpoints_.empty());
  const CheckPoint& checkpoint = checkpoints_.back();

  for (size_t i = checkpoint.pending_symbols_before_checkpoint;
       i < symbols_after_checkpoint_.size(); i++) {
    Symbol::QueryKey name;
    name.name = symbols_after_checkpoint_[i];
    symbols_by_name_.erase(Symbol(&name));
  }
  for (size_t i = checkpoint.pending_files_before_checkpoint;
       i < files_after_checkpoint_.size(); i++) {
    files_by_name_.erase(files_after_checkpoint_[i]);
  }
  for (size_t i = checkpoint.pending_extensions_before_checkpoint;
       i < extensions_after_checkpoint_.size(); i++) {
    extensions_.erase(extensions_after_checkpoint_[i]);
  }

  symbols_after_checkpoint_.resize(
      checkpoint.pending_symbols_before_checkpoint);
  files_after_checkpoint_.resize(checkpoint.pending_files_before_checkpoint);
  extensions_after_checkpoint_.resize(
      checkpoint.pending_extensions_before_checkpoint);

  arena_.RollbackTo(checkpoint.arena_before_checkpoint);
  checkpoints_.pop_back();
}